

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.h
# Opt level: O0

int_type_conflict __thiscall
nlohmann::detail::
lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::get(lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
      *this)

{
  int iVar1;
  int_type_conflict iVar2;
  element_type *peVar3;
  vector<char,_std::allocator<char>_> *this_00;
  long in_RDI;
  value_type *in_stack_ffffffffffffffd8;
  
  *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) + 1;
  peVar3 = std::
           __shared_ptr_access<nlohmann::detail::input_adapter_protocol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<nlohmann::detail::input_adapter_protocol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x171754);
  iVar1 = (**peVar3->_vptr_input_adapter_protocol)();
  *(int *)(in_RDI + 0x10) = iVar1;
  iVar1 = *(int *)(in_RDI + 0x10);
  iVar2 = std::char_traits<char>::eof();
  if (iVar1 != iVar2) {
    this_00 = (vector<char,_std::allocator<char>_> *)(in_RDI + 0x20);
    std::char_traits<char>::to_char_type((int_type_conflict *)(in_RDI + 0x10));
    std::vector<char,_std::allocator<char>_>::push_back(this_00,in_stack_ffffffffffffffd8);
  }
  return *(int_type_conflict *)(in_RDI + 0x10);
}

Assistant:

std::char_traits<char>::int_type get()
{
++chars_read;
current = ia->get_character();
if (JSON_LIKELY(current != std::char_traits<char>::eof()))
{
token_string.push_back(std::char_traits<char>::to_char_type(current));
}
return current;
}